

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int OPENSSL_posix_to_tm(int64_t time,tm *out_tm)

{
  int iVar1;
  int local_58;
  int iStack_54;
  tm tmp_tm;
  tm *out_tm_local;
  int64_t time_local;
  
  tmp_tm.tm_zone = (char *)out_tm;
  memset(&local_58,0,0x38);
  iVar1 = utc_from_posix_time(time,&tmp_tm.tm_mday,&tmp_tm.tm_hour,&tmp_tm.tm_min,&tmp_tm.tm_sec,
                              &iStack_54,&local_58);
  if (iVar1 != 0) {
    tmp_tm.tm_mday = tmp_tm.tm_mday + -0x76c;
    tmp_tm.tm_hour = tmp_tm.tm_hour + -1;
    memcpy(tmp_tm.tm_zone,&local_58,0x38);
  }
  time_local._4_4_ = (uint)(iVar1 != 0);
  return time_local._4_4_;
}

Assistant:

int OPENSSL_posix_to_tm(int64_t time, struct tm *out_tm) {
  struct tm tmp_tm = {};
  if (!utc_from_posix_time(time, &tmp_tm.tm_year, &tmp_tm.tm_mon,
                           &tmp_tm.tm_mday, &tmp_tm.tm_hour, &tmp_tm.tm_min,
                           &tmp_tm.tm_sec)) {
    return 0;
  }
  tmp_tm.tm_year -= 1900;
  tmp_tm.tm_mon -= 1;
  *out_tm = tmp_tm;

  return 1;
}